

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.c
# Opt level: O2

void av1_convolve_x_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_qn,ConvolveParams *conv_params)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ushort uVar3;
  __m256i data;
  __m256i data_00;
  __m256i data_01;
  __m256i data_02;
  __m256i data_03;
  __m256i data_04;
  __m256i data_05;
  __m256i data_06;
  __m256i data_07;
  __m256i data_08;
  __m256i data_09;
  __m256i data_10;
  __m256i data_11;
  __m256i data_12;
  __m256i data_13;
  __m256i data_14;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  short sVar20;
  int iVar21;
  uint uVar22;
  int16_t *piVar23;
  long lVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [32];
  uint8_t *extraout_RDX;
  __m256i *extraout_RDX_00;
  __m256i *extraout_RDX_01;
  __m256i *extraout_RDX_02;
  __m256i *extraout_RDX_03;
  __m256i *palVar27;
  __m256i *filt;
  __m256i *extraout_RDX_04;
  __m256i *filt_00;
  __m256i *filt_01;
  __m256i *filt_02;
  __m256i *extraout_RDX_05;
  __m256i *filt_03;
  __m256i *filt_04;
  __m256i *filt_05;
  __m256i *filt_06;
  __m256i *filt_07;
  __m256i *filt_08;
  __m256i *filt_09;
  __m256i *extraout_RDX_06;
  undefined1 (*pauVar28) [16];
  undefined1 (*pauVar29) [32];
  uint8_t *puVar30;
  __m256i *palVar31;
  uint8_t *puVar32;
  undefined4 in_register_00000084;
  long lVar33;
  undefined1 (*pauVar34) [16];
  undefined4 in_register_0000008c;
  int j_4;
  long lVar35;
  int j_1;
  int j;
  ulong uVar36;
  ulong uVar37;
  undefined2 uVar38;
  undefined2 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [16];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar42 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar43 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined8 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  __m128i res;
  __m128i res_00;
  __m256i filt_256 [4];
  __m256i coeffs [6];
  undefined1 in_stack_fffffffffffffc80 [16];
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 uVar92;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 uVar93;
  undefined1 local_360 [32];
  undefined1 local_320 [32];
  short sStack_2fc;
  undefined2 uStack_2f8;
  undefined2 uStack_2f6;
  undefined2 uStack_2f4;
  undefined2 uStack_2f2;
  undefined2 uStack_2f0;
  undefined2 uStack_2ee;
  undefined2 uStack_2ec;
  undefined2 uStack_2ea;
  undefined2 uStack_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  undefined2 local_2e0;
  short sStack_2de;
  short sStack_2dc;
  undefined1 local_2a0 [16];
  __m256i local_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  __m256i local_1a0;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  longlong local_e0 [22];
  undefined1 auVar55 [64];
  
  palVar31 = (__m256i *)CONCAT44(in_register_00000084,w);
  palVar27 = palVar31;
  iVar21 = get_filter_tap(filter_params_x,subpel_x_qn);
  auVar63 = _DAT_004306d0;
  if (iVar21 == 0xc) {
    uVar22 = conv_params->round_0;
    auVar63 = ZEXT416(7 - uVar22);
    uVar38 = (undefined2)((uint)(1 << ((byte)(uVar22 - 1) & 0x1f)) >> 1);
    auVar70 = ZEXT416(uVar22 - 1);
    local_320._4_4_ = (1 << ((byte)(7 - uVar22) & 0x1f)) >> 1;
    uVar39 = (undefined2)local_320._4_4_;
    iVar21 = get_filter_tap(filter_params_x,subpel_x_qn);
    local_e0[0] = 0x403030202010100;
    local_e0[1] = 0x807070606050504;
    local_e0[2] = 0x403030202010100;
    local_e0[3] = 0x807070606050504;
    local_e0[4] = 0x605050404030302;
    local_e0[5] = 0xa09090808070706;
    local_e0[6] = 0x605050404030302;
    local_e0[7] = 0xa09090808070706;
    if (iVar21 == 6) {
      prepare_coeffs_6t_lowbd(filter_params_x,subpel_x_qn,&local_1a0);
      pauVar28 = (undefined1 (*) [16])(src + -2);
      if (w < 9) {
        lVar24 = (long)dst_stride;
        auVar71._16_16_ = _DAT_004302a0;
        auVar71._0_16_ = _DAT_004302a0;
        auVar2._2_2_ = uVar38;
        auVar2._0_2_ = uVar38;
        auVar2._4_2_ = uVar38;
        auVar2._6_2_ = uVar38;
        auVar2._8_2_ = uVar38;
        auVar2._10_2_ = uVar38;
        auVar2._12_2_ = uVar38;
        auVar2._14_2_ = uVar38;
        auVar2._16_2_ = uVar38;
        auVar2._18_2_ = uVar38;
        auVar2._20_2_ = uVar38;
        auVar2._22_2_ = uVar38;
        auVar2._24_2_ = uVar38;
        auVar2._26_2_ = uVar38;
        auVar2._28_2_ = uVar38;
        auVar2._30_2_ = uVar38;
        auVar1._2_2_ = uVar39;
        auVar1._0_2_ = uVar39;
        auVar1._4_2_ = uVar39;
        auVar1._6_2_ = uVar39;
        auVar1._8_2_ = uVar39;
        auVar1._10_2_ = uVar39;
        auVar1._12_2_ = uVar39;
        auVar1._14_2_ = uVar39;
        auVar1._16_2_ = uVar39;
        auVar1._18_2_ = uVar39;
        auVar1._20_2_ = uVar39;
        auVar1._22_2_ = uVar39;
        auVar1._24_2_ = uVar39;
        auVar1._26_2_ = uVar39;
        auVar1._28_2_ = uVar39;
        auVar1._30_2_ = uVar39;
        auVar86._16_16_ = _DAT_004306d0;
        auVar86._0_16_ = _DAT_004306d0;
        auVar88._16_16_ = _DAT_00430290;
        auVar88._0_16_ = _DAT_00430290;
        for (lVar33 = 0; lVar33 < h; lVar33 = lVar33 + 2) {
          auVar76._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) + ZEXT116(1) * *pauVar28;
          auVar76._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
          auVar50 = vpshufb_avx2(auVar76,auVar86);
          auVar75 = vpshufb_avx2(auVar76,auVar88);
          auVar87 = vpshufb_avx2(auVar76,auVar71);
          auVar52 = vpmaddubsw_avx2(auVar50,(undefined1  [32])local_1a0);
          auVar50 = vpmaddubsw_avx2(auVar75,local_180);
          auVar75 = vpmaddubsw_avx2(auVar87,local_160);
          auVar50 = vpaddw_avx2(auVar50,auVar75);
          auVar52 = vpaddw_avx2(auVar52,auVar2);
          auVar50 = vpaddw_avx2(auVar52,auVar50);
          auVar50 = vpsraw_avx2(auVar50,auVar70);
          auVar50 = vpaddw_avx2(auVar1,auVar50);
          auVar50 = vpsraw_avx2(auVar50,auVar63);
          auVar50 = vpackuswb_avx2(auVar50,auVar50);
          if (w < 5) {
            if (w < 3) {
              vpextrw_avx(auVar50._0_16_,0);
              vpextrw_avx(auVar50._16_16_,0);
            }
            else {
              *(int *)dst = auVar50._0_4_;
              *(int *)(dst + lVar24) = auVar50._16_4_;
            }
          }
          else {
            *(long *)dst = auVar50._0_8_;
            *(long *)(dst + lVar24) = auVar50._16_8_;
          }
          dst = dst + lVar24 * 2;
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)src_stride * 2);
        }
        return;
      }
      lVar24 = 0x800000000;
      uVar25 = 0;
      uVar36 = (ulong)(uint)h;
      if (h < 1) {
        uVar36 = uVar25;
      }
      auVar75._16_16_ = _DAT_004302a0;
      auVar75._0_16_ = _DAT_004302a0;
      auVar52._2_2_ = uVar38;
      auVar52._0_2_ = uVar38;
      auVar52._4_2_ = uVar38;
      auVar52._6_2_ = uVar38;
      auVar52._8_2_ = uVar38;
      auVar52._10_2_ = uVar38;
      auVar52._12_2_ = uVar38;
      auVar52._14_2_ = uVar38;
      auVar52._16_2_ = uVar38;
      auVar52._18_2_ = uVar38;
      auVar52._20_2_ = uVar38;
      auVar52._22_2_ = uVar38;
      auVar52._24_2_ = uVar38;
      auVar52._26_2_ = uVar38;
      auVar52._28_2_ = uVar38;
      auVar52._30_2_ = uVar38;
      auVar50._2_2_ = uVar39;
      auVar50._0_2_ = uVar39;
      auVar50._4_2_ = uVar39;
      auVar50._6_2_ = uVar39;
      auVar50._8_2_ = uVar39;
      auVar50._10_2_ = uVar39;
      auVar50._12_2_ = uVar39;
      auVar50._14_2_ = uVar39;
      auVar50._16_2_ = uVar39;
      auVar50._18_2_ = uVar39;
      auVar50._20_2_ = uVar39;
      auVar50._22_2_ = uVar39;
      auVar50._24_2_ = uVar39;
      auVar50._26_2_ = uVar39;
      auVar50._28_2_ = uVar39;
      auVar50._30_2_ = uVar39;
      auVar87._16_16_ = _DAT_004306d0;
      auVar87._0_16_ = _DAT_004306d0;
      auVar89._16_16_ = _DAT_00430290;
      auVar89._0_16_ = _DAT_00430290;
      pauVar34 = pauVar28;
      for (; uVar25 != uVar36; uVar25 = uVar25 + 1) {
        lVar33 = lVar24;
        for (uVar37 = 0; uVar37 < (uint)w; uVar37 = uVar37 + 0x10) {
          auVar77._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20)) +
               ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar37),0);
          auVar77._16_16_ =
               ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar37),0x10) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20));
          auVar1 = vpshufb_avx2(auVar77,auVar87);
          auVar2 = vpshufb_avx2(auVar77,auVar89);
          auVar71 = vpshufb_avx2(auVar77,auVar75);
          auVar77 = vpmaddubsw_avx2(auVar1,(undefined1  [32])local_1a0);
          auVar1 = vpmaddubsw_avx2(auVar2,local_180);
          auVar2 = vpmaddubsw_avx2(auVar71,local_160);
          auVar1 = vpaddw_avx2(auVar1,auVar2);
          auVar77 = vpaddw_avx2(auVar77,auVar52);
          auVar1 = vpaddw_avx2(auVar77,auVar1);
          auVar1 = vpsraw_avx2(auVar1,auVar70);
          auVar1 = vpaddw_avx2(auVar50,auVar1);
          auVar1 = vpsraw_avx2(auVar1,auVar63);
          auVar62 = vpackuswb_avx(auVar1._0_16_,auVar1._16_16_);
          *(undefined1 (*) [16])(dst + uVar37) = auVar62;
          lVar33 = lVar33 + 0x1000000000;
        }
        dst = dst + dst_stride;
        lVar24 = lVar24 + ((long)src_stride << 0x20);
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride);
      }
      return;
    }
    if (iVar21 == 0xc) {
      prepare_coeffs_12taps(filter_params_x,subpel_x_qn,&local_1a0);
      uVar3 = filter_params_x->taps >> 1;
      iVar21 = 1 << ((byte)uVar22 & 0x1f);
      local_2e0 = (undefined2)(iVar21 >> 1);
      sStack_2de = (short)(iVar21 >> 0x11);
      local_320._0_4_ = local_320._4_4_;
      local_320._8_4_ = local_320._4_4_;
      local_320._12_4_ = local_320._4_4_;
      local_320._16_4_ = local_320._4_4_;
      local_320._20_4_ = local_320._4_4_;
      local_320._24_4_ = local_320._4_4_;
      local_320._28_4_ = local_320._4_4_;
      if (w < 5) {
        pauVar28 = (undefined1 (*) [16])(src + (1 - (ulong)uVar3));
        lVar33 = (long)dst_stride * 2;
        lVar24 = (long)src_stride * 2;
        for (lVar35 = 0; lVar35 < h; lVar35 = lVar35 + 2) {
          auVar44._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) + ZEXT116(1) * *pauVar28;
          auVar44._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
          auVar87 = vpunpcklbw_avx2(auVar44,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar75 = vpunpckhbw_avx2(auVar44,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar50 = vpshufd_avx2(auVar87,0xe6);
          auVar52 = vpshuflw_avx2(auVar50,0x50);
          auVar52 = vpshufhw_avx2(auVar52,0xfa);
          auVar87 = vpunpcklwd_avx2(auVar87,auVar87);
          local_260 = (__m256i)vpalignr_avx2(auVar50,auVar87,2);
          local_240 = vpalignr_avx2(auVar52,auVar87,10);
          auVar87 = vpunpcklwd_avx2(auVar75,auVar75);
          local_220 = vpalignr_avx2(auVar75,auVar52,2);
          local_200 = vpalignr_avx2(auVar87,auVar52,10);
          auVar50 = vpshufd_avx2(auVar75,0xe6);
          auVar52 = vpshuflw_avx2(auVar50,0x50);
          auVar52 = vpshufd_avx2(auVar52,0xf4);
          local_1e0 = vpalignr_avx2(auVar50,auVar87,2);
          auVar50 = vpalignr_avx2(auVar52,auVar87,10);
          local_1c0 = auVar50;
          convolve_12taps(&local_260,&local_1a0);
          auVar15._2_2_ = sStack_2de;
          auVar15._0_2_ = local_2e0;
          auVar15._4_2_ = local_2e0;
          auVar15._6_2_ = sStack_2de;
          auVar15._8_2_ = local_2e0;
          auVar15._10_2_ = sStack_2de;
          auVar15._12_2_ = local_2e0;
          auVar15._14_2_ = sStack_2de;
          auVar15._16_2_ = local_2e0;
          auVar15._18_2_ = sStack_2de;
          auVar15._20_2_ = local_2e0;
          auVar15._22_2_ = sStack_2de;
          auVar15._24_2_ = local_2e0;
          auVar15._26_2_ = sStack_2de;
          auVar15._28_2_ = local_2e0;
          auVar15._30_2_ = sStack_2de;
          auVar50 = vpaddd_avx2(auVar50,auVar15);
          auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar22));
          auVar50 = vpaddd_avx2(auVar50,local_320);
          auVar50 = vpsrad_avx2(auVar50,auVar63);
          auVar50 = vpackssdw_avx2(auVar50,auVar50);
          auVar50 = vpackuswb_avx2(auVar50,auVar50);
          if (w < 3) {
            vpextrw_avx(auVar50._0_16_,0);
            vpextrw_avx(auVar50._16_16_,0);
          }
          else {
            *(int *)dst = auVar50._0_4_;
            *(int *)(dst + dst_stride) = auVar50._16_4_;
          }
          dst = dst + lVar33;
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar24);
        }
        return;
      }
      iVar21 = dst_stride >> 0x1f;
      uVar25 = 0;
      uVar36 = (ulong)(uint)h;
      if (h < 1) {
        uVar36 = uVar25;
      }
      uVar90 = (undefined4)uVar36;
      uVar91 = 0;
      puVar30 = src + (5 - (ulong)uVar3);
      for (; uVar25 != CONCAT44(uVar91,uVar90); uVar25 = uVar25 + 1) {
        for (uVar36 = 0; uVar36 < (uint)w; uVar36 = uVar36 + 8) {
          auVar46._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar30 + uVar36) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar30 + (uVar36 - 4));
          auVar46._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar30 + uVar36);
          auVar87 = vpunpcklbw_avx2(auVar46,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar75 = vpunpckhbw_avx2(auVar46,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar50 = vpshufd_avx2(auVar87,0xe6);
          auVar52 = vpshuflw_avx2(auVar50,0x50);
          auVar52 = vpshufhw_avx2(auVar52,0xfa);
          auVar87 = vpunpcklwd_avx2(auVar87,auVar87);
          local_260 = (__m256i)vpalignr_avx2(auVar50,auVar87,2);
          local_240 = vpalignr_avx2(auVar52,auVar87,10);
          auVar87 = vpunpcklwd_avx2(auVar75,auVar75);
          local_220 = vpalignr_avx2(auVar75,auVar52,2);
          local_200 = vpalignr_avx2(auVar87,auVar52,10);
          auVar50 = vpshufd_avx2(auVar75,0xe6);
          auVar52 = vpshuflw_avx2(auVar50,0x50);
          auVar52 = vpshufd_avx2(auVar52,0xf4);
          local_1e0 = vpalignr_avx2(auVar50,auVar87,2);
          auVar50 = vpalignr_avx2(auVar52,auVar87,10);
          local_1c0 = auVar50;
          convolve_12taps(&local_260,&local_1a0);
          auVar17._2_2_ = sStack_2de;
          auVar17._0_2_ = local_2e0;
          auVar17._4_2_ = local_2e0;
          auVar17._6_2_ = sStack_2de;
          auVar17._8_2_ = local_2e0;
          auVar17._10_2_ = sStack_2de;
          auVar17._12_2_ = local_2e0;
          auVar17._14_2_ = sStack_2de;
          auVar17._16_2_ = local_2e0;
          auVar17._18_2_ = sStack_2de;
          auVar17._20_2_ = local_2e0;
          auVar17._22_2_ = sStack_2de;
          auVar17._24_2_ = local_2e0;
          auVar17._26_2_ = sStack_2de;
          auVar17._28_2_ = local_2e0;
          auVar17._30_2_ = sStack_2de;
          auVar50 = vpaddd_avx2(auVar50,auVar17);
          auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar22));
          auVar50 = vpaddd_avx2(auVar50,local_320);
          auVar50 = vpsrad_avx2(auVar50,auVar63);
          auVar50 = vpackssdw_avx2(auVar50,auVar50);
          auVar50 = vpackuswb_avx2(auVar50,auVar50);
          auVar70 = vpunpckldq_avx(auVar50._0_16_,auVar50._16_16_);
          *(long *)(dst + uVar36) = auVar70._0_8_;
        }
        dst = dst + CONCAT44(iVar21,dst_stride);
        puVar30 = puVar30 + src_stride;
      }
      return;
    }
    prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,&local_1a0);
    if (iVar21 != 4) {
      pauVar28 = (undefined1 (*) [16])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
      local_e0[8] = 0x807070606050504;
      local_e0[9] = 0xc0b0b0a0a090908;
      local_e0[10] = 0x807070606050504;
      local_e0[0xb] = 0xc0b0b0a0a090908;
      local_e0[0xc] = 0xa09090808070706;
      local_e0[0xd] = 0xe0d0d0c0c0b0b0a;
      local_e0[0xe] = 0xa09090808070706;
      local_e0[0xf] = 0xe0d0d0c0c0b0b0a;
      palVar31 = (__m256i *)(ulong)(uint)dst_stride;
      if (w < 9) {
        iVar21 = h >> 0x1f;
        lVar35 = (long)dst_stride;
        lVar24 = lVar35 * 2;
        lVar33 = 0;
        while( true ) {
          if (CONCAT44(iVar21,h) <= lVar33) break;
          auVar47._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) + ZEXT116(1) * *pauVar28;
          auVar47._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
          data[2]._0_4_ = h;
          data[0] = in_stack_fffffffffffffc80._0_8_;
          data[1] = in_stack_fffffffffffffc80._8_8_;
          data[2]._4_4_ = iVar21;
          data[3]._0_4_ = (int)lVar24;
          data[3]._4_4_ = (int)((ulong)lVar24 >> 0x20);
          convolve_lowbd_x(&local_1a0,data,(__m256i *)local_e0,palVar31);
          auVar18._2_2_ = uVar38;
          auVar18._0_2_ = uVar38;
          auVar18._4_2_ = uVar38;
          auVar18._6_2_ = uVar38;
          auVar18._8_2_ = uVar38;
          auVar18._10_2_ = uVar38;
          auVar18._12_2_ = uVar38;
          auVar18._14_2_ = uVar38;
          auVar18._16_2_ = uVar38;
          auVar18._18_2_ = uVar38;
          auVar18._20_2_ = uVar38;
          auVar18._22_2_ = uVar38;
          auVar18._24_2_ = uVar38;
          auVar18._26_2_ = uVar38;
          auVar18._28_2_ = uVar38;
          auVar18._30_2_ = uVar38;
          auVar50 = vpaddw_avx2(auVar47,auVar18);
          auVar50 = vpsraw_avx2(auVar50,auVar70);
          auVar6._2_2_ = uVar39;
          auVar6._0_2_ = uVar39;
          auVar6._4_2_ = uVar39;
          auVar6._6_2_ = uVar39;
          auVar6._8_2_ = uVar39;
          auVar6._10_2_ = uVar39;
          auVar6._12_2_ = uVar39;
          auVar6._14_2_ = uVar39;
          auVar6._16_2_ = uVar39;
          auVar6._18_2_ = uVar39;
          auVar6._20_2_ = uVar39;
          auVar6._22_2_ = uVar39;
          auVar6._24_2_ = uVar39;
          auVar6._26_2_ = uVar39;
          auVar6._28_2_ = uVar39;
          auVar6._30_2_ = uVar39;
          auVar50 = vpaddw_avx2(auVar50,auVar6);
          auVar50 = vpsraw_avx2(auVar50,auVar63);
          auVar50 = vpackuswb_avx2(auVar50,auVar50);
          if (w < 5) {
            if (w < 3) {
              vpextrw_avx(auVar50._0_16_,0);
              vpextrw_avx(auVar50._16_16_,0);
            }
            else {
              *(int *)dst = auVar50._0_4_;
              *(int *)(dst + lVar35) = auVar50._16_4_;
            }
          }
          else {
            *(long *)dst = auVar50._0_8_;
            *(long *)(dst + lVar35) = auVar50._16_8_;
          }
          lVar33 = lVar33 + 2;
          dst = dst + lVar24;
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)src_stride * 2);
          palVar31 = extraout_RDX_01;
        }
        return;
      }
      lVar24 = 0x800000000;
      palVar27 = (__m256i *)0x0;
      palVar31 = (__m256i *)(ulong)(uint)h;
      if (h < 1) {
        palVar31 = palVar27;
      }
      uVar90 = SUB84(palVar31,0);
      uVar91 = 0;
      pauVar34 = pauVar28;
      while (palVar27 != palVar31) {
        uVar92 = SUB84(palVar27,0);
        uVar93 = (undefined4)((ulong)palVar27 >> 0x20);
        lVar33 = lVar24;
        for (uVar36 = 0; uVar36 < (uint)w; uVar36 = uVar36 + 0x10) {
          auVar51._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20)) +
               ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar36),0);
          auVar51._16_16_ =
               ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar36),0x10) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20));
          data_00[2]._0_4_ = uVar90;
          data_00[0] = in_stack_fffffffffffffc80._0_8_;
          data_00[1] = in_stack_fffffffffffffc80._8_8_;
          data_00[2]._4_4_ = uVar91;
          data_00[3]._0_4_ = uVar92;
          data_00[3]._4_4_ = uVar93;
          convolve_lowbd_x(&local_1a0,data_00,(__m256i *)local_e0,palVar27);
          auVar19._2_2_ = uVar38;
          auVar19._0_2_ = uVar38;
          auVar19._4_2_ = uVar38;
          auVar19._6_2_ = uVar38;
          auVar19._8_2_ = uVar38;
          auVar19._10_2_ = uVar38;
          auVar19._12_2_ = uVar38;
          auVar19._14_2_ = uVar38;
          auVar19._16_2_ = uVar38;
          auVar19._18_2_ = uVar38;
          auVar19._20_2_ = uVar38;
          auVar19._22_2_ = uVar38;
          auVar19._24_2_ = uVar38;
          auVar19._26_2_ = uVar38;
          auVar19._28_2_ = uVar38;
          auVar19._30_2_ = uVar38;
          auVar50 = vpaddw_avx2(auVar51,auVar19);
          auVar50 = vpsraw_avx2(auVar50,auVar70);
          auVar7._2_2_ = uVar39;
          auVar7._0_2_ = uVar39;
          auVar7._4_2_ = uVar39;
          auVar7._6_2_ = uVar39;
          auVar7._8_2_ = uVar39;
          auVar7._10_2_ = uVar39;
          auVar7._12_2_ = uVar39;
          auVar7._14_2_ = uVar39;
          auVar7._16_2_ = uVar39;
          auVar7._18_2_ = uVar39;
          auVar7._20_2_ = uVar39;
          auVar7._22_2_ = uVar39;
          auVar7._24_2_ = uVar39;
          auVar7._26_2_ = uVar39;
          auVar7._28_2_ = uVar39;
          auVar7._30_2_ = uVar39;
          auVar50 = vpaddw_avx2(auVar50,auVar7);
          auVar50 = vpsraw_avx2(auVar50,auVar63);
          auVar62 = vpackuswb_avx(auVar50._0_16_,auVar50._16_16_);
          *(undefined1 (*) [16])(dst + uVar36) = auVar62;
          lVar33 = lVar33 + 0x1000000000;
          palVar27 = extraout_RDX_03;
        }
        dst = dst + dst_stride;
        lVar24 = lVar24 + ((long)src_stride << 0x20);
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride);
        palVar31 = (__m256i *)CONCAT44(uVar91,uVar90);
        palVar27 = (__m256i *)(CONCAT44(uVar93,uVar92) + 1);
      }
      return;
    }
    pauVar28 = (undefined1 (*) [16])(src + -1);
    auVar16._2_2_ = uVar38;
    auVar16._0_2_ = uVar38;
    auVar16._4_2_ = uVar38;
    auVar16._6_2_ = uVar38;
    auVar16._8_2_ = uVar38;
    auVar16._10_2_ = uVar38;
    auVar16._12_2_ = uVar38;
    auVar16._14_2_ = uVar38;
    auVar16._16_2_ = uVar38;
    auVar16._18_2_ = uVar38;
    auVar16._20_2_ = uVar38;
    auVar16._22_2_ = uVar38;
    auVar16._24_2_ = uVar38;
    auVar16._26_2_ = uVar38;
    auVar16._28_2_ = uVar38;
    auVar16._30_2_ = uVar38;
    auVar5._2_2_ = uVar39;
    auVar5._0_2_ = uVar39;
    auVar5._4_2_ = uVar39;
    auVar5._6_2_ = uVar39;
    auVar5._8_2_ = uVar39;
    auVar5._10_2_ = uVar39;
    auVar5._12_2_ = uVar39;
    auVar5._14_2_ = uVar39;
    auVar5._16_2_ = uVar39;
    auVar5._18_2_ = uVar39;
    auVar5._20_2_ = uVar39;
    auVar5._22_2_ = uVar39;
    auVar5._24_2_ = uVar39;
    auVar5._26_2_ = uVar39;
    auVar5._28_2_ = uVar39;
    auVar5._30_2_ = uVar39;
    if (w < 9) {
      lVar24 = (long)dst_stride;
      auVar82._16_16_ = _DAT_004306d0;
      auVar82._0_16_ = _DAT_004306d0;
      auVar84._16_16_ = _DAT_00430290;
      auVar84._0_16_ = _DAT_00430290;
      for (lVar33 = 0; lVar33 < h; lVar33 = lVar33 + 2) {
        auVar64._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) + ZEXT116(1) * *pauVar28;
        auVar64._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
        auVar50 = vpshufb_avx2(auVar64,auVar82);
        auVar52 = vpshufb_avx2(auVar64,auVar84);
        auVar50 = vpmaddubsw_avx2(auVar50,local_180);
        auVar52 = vpmaddubsw_avx2(auVar52,local_160);
        auVar50 = vpaddw_avx2(auVar50,auVar16);
        auVar50 = vpaddw_avx2(auVar50,auVar52);
        auVar50 = vpsraw_avx2(auVar50,auVar70);
        auVar50 = vpaddw_avx2(auVar50,auVar5);
        auVar50 = vpsraw_avx2(auVar50,auVar63);
        auVar50 = vpackuswb_avx2(auVar50,auVar50);
        if (w < 5) {
          if (w < 3) {
            vpextrw_avx(auVar50._0_16_,0);
            vpextrw_avx(auVar50._16_16_,0);
          }
          else {
            *(int *)dst = auVar50._0_4_;
            *(int *)(dst + lVar24) = auVar50._16_4_;
          }
        }
        else {
          *(long *)dst = auVar50._0_8_;
          *(long *)(dst + lVar24) = auVar50._16_8_;
        }
        dst = dst + lVar24 * 2;
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)src_stride * 2);
      }
      return;
    }
    lVar24 = 0x800000000;
    uVar25 = 0;
    uVar36 = (ulong)(uint)h;
    if (h < 1) {
      uVar36 = uVar25;
    }
    auVar83._16_16_ = _DAT_004306d0;
    auVar83._0_16_ = _DAT_004306d0;
    auVar85._16_16_ = _DAT_00430290;
    auVar85._0_16_ = _DAT_00430290;
    pauVar34 = pauVar28;
    for (; uVar25 != uVar36; uVar25 = uVar25 + 1) {
      lVar33 = lVar24;
      for (uVar37 = 0; uVar37 < (uint)w; uVar37 = uVar37 + 0x10) {
        auVar67._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20)) +
             ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar37),0);
        auVar67._16_16_ =
             ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + uVar37),0x10) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20));
        auVar50 = vpshufb_avx2(auVar67,auVar83);
        auVar52 = vpshufb_avx2(auVar67,auVar85);
        auVar50 = vpmaddubsw_avx2(auVar50,local_180);
        auVar52 = vpmaddubsw_avx2(auVar52,local_160);
        auVar50 = vpaddw_avx2(auVar50,auVar16);
        auVar50 = vpaddw_avx2(auVar50,auVar52);
        auVar50 = vpsraw_avx2(auVar50,auVar70);
        auVar50 = vpaddw_avx2(auVar50,auVar5);
        auVar50 = vpsraw_avx2(auVar50,auVar63);
        auVar62 = vpackuswb_avx(auVar50._0_16_,auVar50._16_16_);
        *(undefined1 (*) [16])(dst + uVar37) = auVar62;
        lVar33 = lVar33 + 0x1000000000;
      }
      dst = dst + dst_stride;
      lVar24 = lVar24 + ((long)src_stride << 0x20);
      pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride);
    }
    return;
  }
  sStack_2fc = (short)(dst_stride >> 0x1f);
  sVar20 = sStack_2fc;
  if (iVar21 == 4) {
    piVar23 = filter_params_x->filter_ptr;
    puVar30 = (uint8_t *)(ulong)((uint)filter_params_x->taps * (subpel_x_qn & 0xfU));
    auVar70 = vpsraw_avx(*(undefined1 (*) [16])(piVar23 + (long)puVar30),1);
    auVar63 = vpshufb_avx(auVar70,_DAT_00430250);
    pauVar28 = (undefined1 (*) [16])(src + -1);
    auVar70 = vpshufb_avx(auVar70,_DAT_00430260);
    if (w == 2) {
      auVar62._8_2_ = 0x22;
      auVar62._0_8_ = 0x22002200220022;
      auVar62._10_2_ = 0x22;
      auVar62._12_2_ = 0x22;
      auVar62._14_2_ = 0x22;
      do {
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)*pauVar28;
        auVar69 = vmovhps_avx(auVar69,*(undefined8 *)(*pauVar28 + src_stride));
        auVar41 = vpshufb_avx(auVar69,ZEXT816(0xa09090802010100));
        auVar60 = vpshufb_avx(auVar69,ZEXT816(0xc0b0b0a04030302));
        auVar69 = vpmaddubsw_avx(auVar41,auVar63);
        auVar41 = vpmaddubsw_avx(auVar60,auVar70);
        auVar69 = vpaddw_avx(auVar69,auVar41);
        auVar69 = vpaddw_avx(auVar69,auVar62);
        auVar69 = vpsraw_avx(auVar69,6);
        auVar69 = vpackuswb_avx(auVar69,auVar69);
        vpextrw_avx(auVar69,0);
        vpextrw_avx(auVar69,1);
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride * 2);
        h = h - 2;
      } while (h != 0);
      return;
    }
    if (w != 8) {
      if (w == 4) {
        local_2a0._8_2_ = 0x22;
        local_2a0._0_8_ = 0x22002200220022;
        local_2a0._10_2_ = 0x22;
        local_2a0._12_2_ = 0x22;
        local_2a0._14_2_ = 0x22;
        do {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)*pauVar28;
          auVar62 = vmovhps_avx(auVar41,*(undefined8 *)(*pauVar28 + src_stride));
          auVar69 = vpshufb_avx(auVar62,_DAT_0047b100);
          auVar41 = vpshufb_avx(auVar62,_DAT_0047b110);
          auVar62 = vpmaddubsw_avx(auVar69,auVar63);
          auVar69 = vpmaddubsw_avx(auVar41,auVar70);
          auVar62 = vpaddw_avx(auVar62,auVar69);
          auVar62 = vpaddw_avx(auVar62,local_2a0);
          vpsraw_avx(auVar62,6);
          res[1]._6_2_ = sStack_2fc;
          res[1]._0_6_ = (int6)dst_stride;
          res[0] = (longlong)dst;
          pack_store_4x2_sse2(res,puVar30,(ptrdiff_t)piVar23);
          pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride * 2);
          dst = dst + dst_stride * 2;
          h = h - 2;
          puVar30 = extraout_RDX;
        } while (h != 0);
        return;
      }
      lVar24 = 0x800000000;
      prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,&local_1a0);
      uVar25 = 0;
      uVar36 = (ulong)(uint)h;
      if (h < 1) {
        uVar36 = uVar25;
      }
      auVar66._16_16_ = _DAT_004306d0;
      auVar66._0_16_ = _DAT_004306d0;
      auVar73._16_16_ = _DAT_00430290;
      auVar73._0_16_ = _DAT_00430290;
      auVar79._8_2_ = 0x22;
      auVar79._0_8_ = 0x22002200220022;
      auVar79._10_2_ = 0x22;
      auVar79._12_2_ = 0x22;
      auVar79._14_2_ = 0x22;
      auVar79._16_2_ = 0x22;
      auVar79._18_2_ = 0x22;
      auVar79._20_2_ = 0x22;
      auVar79._22_2_ = 0x22;
      auVar79._24_2_ = 0x22;
      auVar79._26_2_ = 0x22;
      auVar79._28_2_ = 0x22;
      auVar79._30_2_ = 0x22;
      pauVar34 = pauVar28;
      for (; uVar25 != uVar36; uVar25 = uVar25 + 1) {
        lVar33 = lVar24;
        for (lVar35 = 0; lVar35 < w; lVar35 = lVar35 + 0x10) {
          auVar81._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20)) +
               ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + lVar35),0);
          auVar81._16_16_ =
               ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(*pauVar34 + lVar35),0x10) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + (lVar33 >> 0x20));
          auVar50 = vpshufb_avx2(auVar81,auVar66);
          auVar50 = vpmaddubsw_avx2(auVar50,local_180);
          auVar52 = vpshufb_avx2(auVar81,auVar73);
          auVar52 = vpmaddubsw_avx2(auVar52,local_160);
          auVar50 = vpaddw_avx2(auVar50,auVar52);
          auVar50 = vpaddw_avx2(auVar50,auVar79);
          auVar50 = vpsraw_avx2(auVar50,6);
          auVar63 = vpackuswb_avx(auVar50._0_16_,auVar50._16_16_);
          *(undefined1 (*) [16])(dst + lVar35) = auVar63;
          lVar33 = lVar33 + 0x1000000000;
        }
        dst = dst + dst_stride;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + src_stride);
        lVar24 = lVar24 + ((long)src_stride << 0x20);
      }
      return;
    }
    prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,&local_1a0);
    auVar65._16_16_ = _DAT_004306d0;
    auVar65._0_16_ = _DAT_004306d0;
    auVar72._16_16_ = _DAT_00430290;
    auVar72._0_16_ = _DAT_00430290;
    auVar78._8_2_ = 0x22;
    auVar78._0_8_ = 0x22002200220022;
    auVar78._10_2_ = 0x22;
    auVar78._12_2_ = 0x22;
    auVar78._14_2_ = 0x22;
    auVar78._16_2_ = 0x22;
    auVar78._18_2_ = 0x22;
    auVar78._20_2_ = 0x22;
    auVar78._22_2_ = 0x22;
    auVar78._24_2_ = 0x22;
    auVar78._26_2_ = 0x22;
    auVar78._28_2_ = 0x22;
    auVar78._30_2_ = 0x22;
    for (lVar24 = 0; lVar24 < h; lVar24 = lVar24 + 2) {
      auVar80._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) + ZEXT116(1) * *pauVar28;
      auVar80._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
      auVar50 = vpshufb_avx2(auVar80,auVar65);
      auVar50 = vpmaddubsw_avx2(auVar50,local_180);
      auVar52 = vpshufb_avx2(auVar80,auVar72);
      auVar52 = vpmaddubsw_avx2(auVar52,local_160);
      auVar50 = vpaddw_avx2(auVar50,auVar52);
      auVar50 = vpaddw_avx2(auVar50,auVar78);
      auVar50 = vpsraw_avx2(auVar50,6);
      auVar50 = vpackuswb_avx2(auVar50,local_180);
      *(long *)dst = auVar50._0_8_;
      *(long *)(dst + dst_stride) = auVar50._16_8_;
      dst = dst + (long)dst_stride * 2;
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + (long)src_stride * 2);
    }
    return;
  }
  if (iVar21 == 2) {
    if (subpel_x_qn != 8) {
      piVar23 = filter_params_x->filter_ptr;
      if (8 < w) {
        auVar63 = ZEXT416(*(uint *)(piVar23 +
                                   (ulong)((uint)filter_params_x->taps * (subpel_x_qn & 0xfU)) + 3))
        ;
        auVar49._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar63;
        auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar63;
        auVar50 = vpsrlw_avx2(auVar49,1);
        local_1a0 = (__m256i)vpshufb_avx2(auVar50,_DAT_0047b040);
        if (w == 0x10) {
          pauVar28 = (undefined1 (*) [16])(src + 1);
          auVar61._8_2_ = 0x22;
          auVar61._0_8_ = 0x22002200220022;
          auVar61._10_2_ = 0x22;
          auVar61._12_2_ = 0x22;
          auVar61._14_2_ = 0x22;
          auVar61._16_2_ = 0x22;
          auVar61._18_2_ = 0x22;
          auVar61._20_2_ = 0x22;
          auVar61._22_2_ = 0x22;
          auVar61._24_2_ = 0x22;
          auVar61._26_2_ = 0x22;
          auVar61._28_2_ = 0x22;
          auVar61._30_2_ = 0x22;
          do {
            auVar68._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(pauVar28[-1] + (long)src_stride + 0xf) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pauVar28[-1] + 0xf);
            auVar68._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pauVar28[-1] + (long)src_stride + 0xf);
            auVar74._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar28 + src_stride) +
                 ZEXT116(1) * *pauVar28;
            auVar74._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar28 + src_stride);
            auVar50 = vpunpcklbw_avx2(auVar68,auVar74);
            auVar52 = vpunpckhbw_avx2(auVar68,auVar74);
            auVar50 = vpmaddubsw_avx2(auVar50,(undefined1  [32])local_1a0);
            auVar52 = vpmaddubsw_avx2(auVar52,(undefined1  [32])local_1a0);
            auVar50 = vpaddw_avx2(auVar50,auVar61);
            auVar75 = vpsraw_avx2(auVar50,6);
            auVar50 = vpaddw_avx2(auVar52,auVar61);
            auVar50 = vpsraw_avx2(auVar50,6);
            auVar50 = vpackuswb_avx2(auVar75,auVar50);
            *(undefined1 (*) [16])dst = auVar50._0_16_;
            *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar50._16_16_;
            dst = *(undefined1 (*) [16])dst + dst_stride * 2;
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride * 2);
            h = h - 2;
          } while (h != 0);
          return;
        }
        if (w != 0x20) {
          if (w == 0x40) {
            do {
              sr_x_2tap_32_avx2(src,&local_1a0,dst);
              sr_x_2tap_32_avx2(src + 0x20,&local_1a0,dst + 0x20);
              src = src + src_stride;
              dst = dst + dst_stride;
              h = h - 1;
            } while (h != 0);
            return;
          }
          puVar30 = src + 0x60;
          do {
            sr_x_2tap_32_avx2(puVar30 + -0x60,&local_1a0,dst);
            sr_x_2tap_32_avx2(puVar30 + -0x40,&local_1a0,dst + 0x20);
            sr_x_2tap_32_avx2(puVar30 + -0x20,&local_1a0,dst + 0x40);
            sr_x_2tap_32_avx2(puVar30,&local_1a0,dst + 0x60);
            dst = dst + dst_stride;
            puVar30 = puVar30 + src_stride;
            h = h - 1;
          } while (h != 0);
          return;
        }
        do {
          sr_x_2tap_32_avx2(src,&local_1a0,dst);
          src = src + src_stride;
          dst = dst + dst_stride;
          h = h - 1;
        } while (h != 0);
        return;
      }
      auVar70 = vpsrlw_avx(ZEXT416(*(uint *)(piVar23 +
                                            (ulong)((uint)filter_params_x->taps *
                                                   (subpel_x_qn & 0xfU)) + 3)),1);
      auVar70 = vpshufb_avx(auVar70,_DAT_00430240);
      lVar24 = (long)src_stride;
      iVar21 = src_stride * 2;
      if (w == 2) {
        auVar63._8_2_ = 0x22;
        auVar63._0_8_ = 0x22002200220022;
        auVar63._10_2_ = 0x22;
        auVar63._12_2_ = 0x22;
        auVar63._14_2_ = 0x22;
        do {
          auVar62 = vpinsrd_avx(ZEXT416(*(uint *)src),*(undefined4 *)((long)src + lVar24),1);
          auVar62 = vpshufb_avx(auVar62,ZEXT816(0x605050402010100));
          auVar62 = vpmaddubsw_avx(auVar62,auVar70);
          auVar62 = vpaddw_avx(auVar62,auVar63);
          auVar62 = vpsraw_avx(auVar62,6);
          auVar62 = vpackuswb_avx(auVar62,auVar62);
          vpextrw_avx(auVar62,0);
          vpextrw_avx(auVar62,1);
          src = (uint8_t *)((long)src + (long)iVar21);
          h = h - 2;
        } while (h != 0);
        return;
      }
      if (w == 4) {
        sStack_2dc = (short)(iVar21 >> 0x1f);
        do {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)src;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)((long)src + lVar24);
          auVar63 = vpunpcklbw_avx(auVar42,auVar59);
          auVar63 = vpshufb_avx(auVar63,_DAT_0047b0c0);
          auVar63 = vpmaddubsw_avx(auVar63,auVar70);
          auVar4._8_2_ = 0x22;
          auVar4._0_8_ = 0x22002200220022;
          auVar4._10_2_ = 0x22;
          auVar4._12_2_ = 0x22;
          auVar4._14_2_ = 0x22;
          auVar63 = vpaddw_avx(auVar63,auVar4);
          vpsraw_avx(auVar63,6);
          res_00[1] = (long)dst_stride;
          res_00[0] = (longlong)dst;
          pack_store_4x2_sse2(res_00,(uint8_t *)palVar31,(ptrdiff_t)piVar23);
          src = (uint8_t *)((long)src + CONCAT26(sStack_2dc,(int6)iVar21));
          dst = dst + dst_stride * 2;
          h = h - 2;
          palVar31 = extraout_RDX_00;
        } while (h != 0);
        return;
      }
      auVar60._8_2_ = 0x22;
      auVar60._0_8_ = 0x22002200220022;
      auVar60._10_2_ = 0x22;
      auVar60._12_2_ = 0x22;
      auVar60._14_2_ = 0x22;
      do {
        auVar62 = vpshufb_avx(*(undefined1 (*) [16])src,auVar63);
        auVar69 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar24),auVar63);
        auVar62 = vpmaddubsw_avx(auVar62,auVar70);
        auVar69 = vpmaddubsw_avx(auVar69,auVar70);
        auVar62 = vpaddw_avx(auVar62,auVar60);
        auVar62 = vpsraw_avx(auVar62,6);
        auVar62 = vpackuswb_avx(auVar62,auVar62);
        auVar69 = vpaddw_avx(auVar69,auVar60);
        auVar69 = vpsraw_avx(auVar69,6);
        auVar69 = vpackuswb_avx(auVar69,auVar69);
        *(long *)dst = auVar62._0_8_;
        *(long *)(dst + dst_stride) = auVar69._0_8_;
        src = *(undefined1 (*) [16])src + iVar21;
        dst = dst + dst_stride * 2;
        h = h - 2;
      } while (h != 0);
      return;
    }
    lVar24 = (long)src_stride;
    if (w == 2) {
      do {
        auVar63 = vpunpckldq_avx(ZEXT416(*(uint *)src),ZEXT416(*(uint *)((long)src + lVar24)));
        auVar70._0_8_ = auVar63._0_8_;
        auVar70._8_8_ = 0;
        auVar63 = vpsrlq_avx(auVar70,8);
        auVar63 = vpavgb_avx(auVar70,auVar63);
        vpextrw_avx(auVar63,0);
        vpextrw_avx(auVar63,2);
        src = (uint8_t *)((long)src + (long)(src_stride * 2));
        h = h - 2;
      } while (h != 0);
      return;
    }
    if (w == 4) {
      do {
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)src;
        auVar63 = vmovhps_avx(auVar43,*(undefined8 *)((long)src + lVar24));
        auVar70 = vpsrlq_avx(auVar63,8);
        auVar63 = vpavgb_avx(auVar63,auVar70);
        *(int *)dst = auVar63._0_4_;
        *(int *)(dst + dst_stride) = auVar63._8_4_;
        src = (uint8_t *)((long)src + (long)(src_stride * 2));
        dst = dst + dst_stride * 2;
        h = h - 2;
      } while (h != 0);
      return;
    }
    if (w == 8) {
      do {
        auVar63 = vpsrldq_avx(*(undefined1 (*) [16])src,1);
        auVar70 = vpsrldq_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar24),1);
        auVar63 = vpavgb_avx(*(undefined1 (*) [16])src,auVar63);
        auVar70 = vpavgb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + lVar24),auVar70);
        *(long *)dst = auVar63._0_8_;
        *(long *)(dst + dst_stride) = auVar70._0_8_;
        src = *(undefined1 (*) [16])src + src_stride * 2;
        dst = dst + dst_stride * 2;
        h = h - 2;
      } while (h != 0);
      return;
    }
    if (w != 0x10) {
      if (w == 0x20) {
        pauVar26 = (undefined1 (*) [32])(src + 1);
        do {
          auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar26[-1] + 0x1f),*pauVar26);
          *(undefined1 (*) [32])dst = auVar50;
          dst = *(undefined1 (*) [32])dst + dst_stride;
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + lVar24);
          h = h - 1;
        } while (h != 0);
        return;
      }
      if (w == 0x40) {
        pauVar29 = (undefined1 (*) [32])(src + 0x21);
        pauVar26 = (undefined1 (*) [32])(dst + 0x20);
        do {
          auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-2] + 0x1f),pauVar29[-1]);
          pauVar26[-1] = auVar50;
          auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-1] + 0x1f),*pauVar29);
          *pauVar26 = auVar50;
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + lVar24);
          pauVar26 = (undefined1 (*) [32])(*pauVar26 + dst_stride);
          h = h - 1;
        } while (h != 0);
        return;
      }
      pauVar29 = (undefined1 (*) [32])(src + 0x61);
      pauVar26 = (undefined1 (*) [32])(dst + 0x60);
      do {
        auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-4] + 0x1f),pauVar29[-3]);
        pauVar26[-3] = auVar50;
        auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-3] + 0x1f),pauVar29[-2]);
        pauVar26[-2] = auVar50;
        auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-2] + 0x1f),pauVar29[-1]);
        pauVar26[-1] = auVar50;
        auVar50 = vpavgb_avx2(*(undefined1 (*) [32])(pauVar29[-1] + 0x1f),*pauVar29);
        *pauVar26 = auVar50;
        pauVar29 = (undefined1 (*) [32])(*pauVar29 + lVar24);
        pauVar26 = (undefined1 (*) [32])(*pauVar26 + dst_stride);
        h = h - 1;
      } while (h != 0);
      return;
    }
    pauVar28 = (undefined1 (*) [16])(src + 1);
    do {
      auVar63 = vpavgb_avx(*(undefined1 (*) [16])(pauVar28[-1] + 0xf),*pauVar28);
      auVar70 = vpavgb_avx(*(undefined1 (*) [16])(pauVar28[-1] + lVar24 + 0xf),
                           *(undefined1 (*) [16])(*pauVar28 + lVar24));
      *(undefined1 (*) [16])dst = auVar63;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar70;
      dst = *(undefined1 (*) [16])dst + dst_stride * 2;
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride * 2);
      h = h - 2;
    } while (h != 0);
    return;
  }
  local_260[1] = 0x807070606050504;
  local_260[0] = 0x403030202010100;
  local_260[2] = 0x403030202010100;
  local_260[3] = 0x807070606050504;
  local_240._8_8_ = 0xa09090808070706;
  local_240._0_8_ = 0x605050404030302;
  local_240._16_8_ = 0x605050404030302;
  local_240._24_8_ = 0xa09090808070706;
  local_220._8_8_ = 0xc0b0b0a0a090908;
  local_220._0_8_ = 0x807070606050504;
  local_220._16_8_ = 0x807070606050504;
  local_220._24_8_ = 0xc0b0b0a0a090908;
  if (iVar21 == 8) {
    local_200._8_8_ = 0xe0d0d0c0c0b0b0a;
    local_200._0_8_ = 0xa09090808070706;
    local_200._16_8_ = 0xa09090808070706;
    local_200._24_8_ = 0xe0d0d0c0c0b0b0a;
    prepare_half_coeffs_8tap_avx2(filter_params_x,subpel_x_qn,&local_1a0);
    puVar30 = (uint8_t *)(long)src_stride;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      palVar31 = (__m256i *)(src + -3);
      auVar48._8_2_ = 0x22;
      auVar48._0_8_ = 0x22002200220022;
      auVar48._10_2_ = 0x22;
      auVar48._12_2_ = 0x22;
      auVar48._14_2_ = 0x22;
      auVar48._16_2_ = 0x22;
      auVar48._18_2_ = 0x22;
      auVar48._20_2_ = 0x22;
      auVar48._22_2_ = 0x22;
      auVar48._24_2_ = 0x22;
      auVar48._26_2_ = 0x22;
      auVar48._28_2_ = 0x22;
      auVar48._30_2_ = 0x22;
      auVar55 = ZEXT3264(auVar48);
      do {
        auVar50 = auVar55._0_32_;
        x_convolve_8tap_8x2_avx2(palVar31,puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
        auVar50 = vpaddw_avx2(auVar50,auVar48);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar50,auVar50);
        *(long *)dst = auVar50._0_8_;
        auVar55 = ZEXT1664(auVar50._16_16_);
        *(long *)(dst + CONCAT26(sStack_2fc,(int6)dst_stride)) = auVar50._16_8_;
        palVar31 = (__m256i *)((long)*palVar31 + (long)(src_stride * 2));
        dst = dst + dst_stride * 2;
        h = h - 2;
      } while (h != 0);
      return;
    case 1:
      sStack_2fc = (short)(dst_stride * 2 >> 0x1f);
      palVar31 = (__m256i *)(src + 5);
      auVar54._8_2_ = 0x22;
      auVar54._0_8_ = 0x22002200220022;
      auVar54._10_2_ = 0x22;
      auVar54._12_2_ = 0x22;
      auVar54._14_2_ = 0x22;
      auVar54._16_2_ = 0x22;
      auVar54._18_2_ = 0x22;
      auVar54._20_2_ = 0x22;
      auVar54._22_2_ = 0x22;
      auVar54._24_2_ = 0x22;
      auVar54._26_2_ = 0x22;
      auVar54._28_2_ = 0x22;
      auVar54._30_2_ = 0x22;
      auVar50 = auVar54;
      break;
    default:
      pauVar26 = (undefined1 (*) [32])(src + 0x65);
      pauVar29 = (undefined1 (*) [32])(dst + 0x60);
      local_360._8_2_ = 0x22;
      local_360._0_8_ = 0x22002200220022;
      local_360._10_2_ = 0x22;
      local_360._12_2_ = 0x22;
      local_360._14_2_ = 0x22;
      local_360._16_2_ = 0x22;
      local_360._18_2_ = 0x22;
      local_360._20_2_ = 0x22;
      local_360._22_2_ = 0x22;
      local_360._24_2_ = 0x22;
      local_360._26_2_ = 0x22;
      local_360._28_2_ = 0x22;
      local_360._30_2_ = 0x22;
      palVar31 = extraout_RDX_02;
      uVar22 = h;
      do {
        uVar40 = *(undefined8 *)(pauVar26[-4] + 0x18);
        uVar56 = *(undefined8 *)pauVar26[-3];
        uVar57 = *(undefined8 *)(pauVar26[-3] + 8);
        uVar58 = *(undefined8 *)(pauVar26[-3] + 0x10);
        auVar52 = pauVar26[-3];
        data_07[2]._0_4_ = h;
        data_07[0] = in_stack_fffffffffffffc80._0_8_;
        data_07[1] = in_stack_fffffffffffffc80._8_8_;
        data_07[2]._4_4_ = in_register_0000008c;
        data_07[3]._0_4_ = in_stack_fffffffffffffc98;
        data_07[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_07,&local_260,palVar31);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_08[2]._0_4_ = h;
        data_08[0] = in_stack_fffffffffffffc80._0_8_;
        data_08[1] = in_stack_fffffffffffffc80._8_8_;
        data_08[2]._4_4_ = in_register_0000008c;
        data_08[3]._0_4_ = in_stack_fffffffffffffc98;
        data_08[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_08,&local_260,filt_03);
        auVar11._8_2_ = uStack_2f8;
        auVar11._0_8_ = uVar40;
        auVar11._10_2_ = uStack_2f6;
        auVar11._12_2_ = uStack_2f4;
        auVar11._14_2_ = uStack_2f2;
        auVar11._16_2_ = uStack_2f0;
        auVar11._18_2_ = uStack_2ee;
        auVar11._20_2_ = uStack_2ec;
        auVar11._22_2_ = uStack_2ea;
        auVar11._24_2_ = uStack_2e8;
        auVar11._26_2_ = uStack_2e6;
        auVar11._28_2_ = uStack_2e4;
        auVar11._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar11);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        pauVar29[-3] = auVar50;
        uVar40 = *(undefined8 *)(pauVar26[-3] + 0x18);
        uVar56 = *(undefined8 *)pauVar26[-2];
        uVar57 = *(undefined8 *)(pauVar26[-2] + 8);
        uVar58 = *(undefined8 *)(pauVar26[-2] + 0x10);
        auVar52 = pauVar26[-2];
        data_09[2]._0_4_ = h;
        data_09[0] = in_stack_fffffffffffffc80._0_8_;
        data_09[1] = in_stack_fffffffffffffc80._8_8_;
        data_09[2]._4_4_ = in_register_0000008c;
        data_09[3]._0_4_ = in_stack_fffffffffffffc98;
        data_09[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_09,&local_260,filt_04);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_10[2]._0_4_ = h;
        data_10[0] = in_stack_fffffffffffffc80._0_8_;
        data_10[1] = in_stack_fffffffffffffc80._8_8_;
        data_10[2]._4_4_ = in_register_0000008c;
        data_10[3]._0_4_ = in_stack_fffffffffffffc98;
        data_10[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_10,&local_260,filt_05);
        auVar12._8_2_ = uStack_2f8;
        auVar12._0_8_ = uVar40;
        auVar12._10_2_ = uStack_2f6;
        auVar12._12_2_ = uStack_2f4;
        auVar12._14_2_ = uStack_2f2;
        auVar12._16_2_ = uStack_2f0;
        auVar12._18_2_ = uStack_2ee;
        auVar12._20_2_ = uStack_2ec;
        auVar12._22_2_ = uStack_2ea;
        auVar12._24_2_ = uStack_2e8;
        auVar12._26_2_ = uStack_2e6;
        auVar12._28_2_ = uStack_2e4;
        auVar12._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar12);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        pauVar29[-2] = auVar50;
        uVar40 = *(undefined8 *)(pauVar26[-2] + 0x18);
        uVar56 = *(undefined8 *)pauVar26[-1];
        uVar57 = *(undefined8 *)(pauVar26[-1] + 8);
        uVar58 = *(undefined8 *)(pauVar26[-1] + 0x10);
        auVar52 = pauVar26[-1];
        data_11[2]._0_4_ = h;
        data_11[0] = in_stack_fffffffffffffc80._0_8_;
        data_11[1] = in_stack_fffffffffffffc80._8_8_;
        data_11[2]._4_4_ = in_register_0000008c;
        data_11[3]._0_4_ = in_stack_fffffffffffffc98;
        data_11[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_11,&local_260,filt_06);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_12[2]._0_4_ = h;
        data_12[0] = in_stack_fffffffffffffc80._0_8_;
        data_12[1] = in_stack_fffffffffffffc80._8_8_;
        data_12[2]._4_4_ = in_register_0000008c;
        data_12[3]._0_4_ = in_stack_fffffffffffffc98;
        data_12[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_12,&local_260,filt_07);
        auVar13._8_2_ = uStack_2f8;
        auVar13._0_8_ = uVar40;
        auVar13._10_2_ = uStack_2f6;
        auVar13._12_2_ = uStack_2f4;
        auVar13._14_2_ = uStack_2f2;
        auVar13._16_2_ = uStack_2f0;
        auVar13._18_2_ = uStack_2ee;
        auVar13._20_2_ = uStack_2ec;
        auVar13._22_2_ = uStack_2ea;
        auVar13._24_2_ = uStack_2e8;
        auVar13._26_2_ = uStack_2e6;
        auVar13._28_2_ = uStack_2e4;
        auVar13._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar13);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        pauVar29[-1] = auVar50;
        uVar40 = *(undefined8 *)(pauVar26[-1] + 0x18);
        uVar56 = *(undefined8 *)*pauVar26;
        uVar57 = *(undefined8 *)(*pauVar26 + 8);
        uVar58 = *(undefined8 *)(*pauVar26 + 0x10);
        auVar52 = *pauVar26;
        data_13[2]._0_4_ = h;
        data_13[0] = in_stack_fffffffffffffc80._0_8_;
        data_13[1] = in_stack_fffffffffffffc80._8_8_;
        data_13[2]._4_4_ = in_register_0000008c;
        data_13[3]._0_4_ = in_stack_fffffffffffffc98;
        data_13[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_13,&local_260,filt_08);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_14[2]._0_4_ = h;
        data_14[0] = in_stack_fffffffffffffc80._0_8_;
        data_14[1] = in_stack_fffffffffffffc80._8_8_;
        data_14[2]._4_4_ = in_register_0000008c;
        data_14[3]._0_4_ = in_stack_fffffffffffffc98;
        data_14[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_14,&local_260,filt_09);
        auVar14._8_2_ = uStack_2f8;
        auVar14._0_8_ = uVar40;
        auVar14._10_2_ = uStack_2f6;
        auVar14._12_2_ = uStack_2f4;
        auVar14._14_2_ = uStack_2f2;
        auVar14._16_2_ = uStack_2f0;
        auVar14._18_2_ = uStack_2ee;
        auVar14._20_2_ = uStack_2ec;
        auVar14._22_2_ = uStack_2ea;
        auVar14._24_2_ = uStack_2e8;
        auVar14._26_2_ = uStack_2e6;
        auVar14._28_2_ = uStack_2e4;
        auVar14._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar14);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        *pauVar29 = auVar50;
        pauVar26 = (undefined1 (*) [32])(puVar30 + (long)*pauVar26);
        pauVar29 = (undefined1 (*) [32])(*pauVar29 + CONCAT26(sStack_2fc,(int6)dst_stride));
        uVar22 = uVar22 - 1;
        palVar31 = extraout_RDX_06;
      } while (uVar22 != 0);
      return;
    case 3:
      pauVar26 = (undefined1 (*) [32])(src + 5);
      palVar31 = extraout_RDX_02;
      uVar22 = h;
      do {
        local_320._0_8_ = *(undefined8 *)(pauVar26[-1] + 0x18);
        local_320._8_8_ = *(undefined8 *)*pauVar26;
        local_320._16_8_ = *(undefined8 *)(*pauVar26 + 8);
        local_320._24_8_ = *(undefined8 *)(*pauVar26 + 0x10);
        auVar52 = *pauVar26;
        data_01[2]._0_4_ = h;
        data_01[0] = in_stack_fffffffffffffc80._0_8_;
        data_01[1] = in_stack_fffffffffffffc80._8_8_;
        data_01[2]._4_4_ = in_register_0000008c;
        data_01[3]._0_4_ = in_stack_fffffffffffffc98;
        data_01[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_01,&local_260,palVar31);
        data_02[2]._0_4_ = h;
        data_02[0] = in_stack_fffffffffffffc80._0_8_;
        data_02[1] = in_stack_fffffffffffffc80._8_8_;
        data_02[2]._4_4_ = in_register_0000008c;
        data_02[3]._0_4_ = in_stack_fffffffffffffc98;
        data_02[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_02,&local_260,filt);
        auVar8._8_2_ = 0x22;
        auVar8._0_8_ = 0x22002200220022;
        auVar8._10_2_ = 0x22;
        auVar8._12_2_ = 0x22;
        auVar8._14_2_ = 0x22;
        auVar8._16_2_ = 0x22;
        auVar8._18_2_ = 0x22;
        auVar8._20_2_ = 0x22;
        auVar8._22_2_ = 0x22;
        auVar8._24_2_ = 0x22;
        auVar8._26_2_ = 0x22;
        auVar8._28_2_ = 0x22;
        auVar8._30_2_ = 0x22;
        auVar50 = vpaddw_avx2(auVar8,local_320);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,auVar8);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        *(undefined1 (*) [32])dst = auVar50;
        dst = *(undefined1 (*) [32])dst + CONCAT26(sStack_2fc,(int6)dst_stride);
        pauVar26 = (undefined1 (*) [32])(puVar30 + (long)*pauVar26);
        uVar22 = uVar22 - 1;
        palVar31 = extraout_RDX_04;
      } while (uVar22 != 0);
      return;
    case 7:
      pauVar26 = (undefined1 (*) [32])(src + 0x25);
      pauVar29 = (undefined1 (*) [32])(dst + 0x20);
      local_360._8_2_ = 0x22;
      local_360._0_8_ = 0x22002200220022;
      local_360._10_2_ = 0x22;
      local_360._12_2_ = 0x22;
      local_360._14_2_ = 0x22;
      local_360._16_2_ = 0x22;
      local_360._18_2_ = 0x22;
      local_360._20_2_ = 0x22;
      local_360._22_2_ = 0x22;
      local_360._24_2_ = 0x22;
      local_360._26_2_ = 0x22;
      local_360._28_2_ = 0x22;
      local_360._30_2_ = 0x22;
      palVar31 = extraout_RDX_02;
      uVar22 = h;
      do {
        uVar40 = *(undefined8 *)(pauVar26[-2] + 0x18);
        uVar56 = *(undefined8 *)pauVar26[-1];
        uVar57 = *(undefined8 *)(pauVar26[-1] + 8);
        uVar58 = *(undefined8 *)(pauVar26[-1] + 0x10);
        auVar52 = pauVar26[-1];
        data_03[2]._0_4_ = h;
        data_03[0] = in_stack_fffffffffffffc80._0_8_;
        data_03[1] = in_stack_fffffffffffffc80._8_8_;
        data_03[2]._4_4_ = in_register_0000008c;
        data_03[3]._0_4_ = in_stack_fffffffffffffc98;
        data_03[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_03,&local_260,palVar31);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_04[2]._0_4_ = h;
        data_04[0] = in_stack_fffffffffffffc80._0_8_;
        data_04[1] = in_stack_fffffffffffffc80._8_8_;
        data_04[2]._4_4_ = in_register_0000008c;
        data_04[3]._0_4_ = in_stack_fffffffffffffc98;
        data_04[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_04,&local_260,filt_00);
        auVar9._8_2_ = uStack_2f8;
        auVar9._0_8_ = uVar40;
        auVar9._10_2_ = uStack_2f6;
        auVar9._12_2_ = uStack_2f4;
        auVar9._14_2_ = uStack_2f2;
        auVar9._16_2_ = uStack_2f0;
        auVar9._18_2_ = uStack_2ee;
        auVar9._20_2_ = uStack_2ec;
        auVar9._22_2_ = uStack_2ea;
        auVar9._24_2_ = uStack_2e8;
        auVar9._26_2_ = uStack_2e6;
        auVar9._28_2_ = uStack_2e4;
        auVar9._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar9);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        pauVar29[-1] = auVar50;
        uVar40 = *(undefined8 *)(pauVar26[-1] + 0x18);
        uVar56 = *(undefined8 *)*pauVar26;
        uVar57 = *(undefined8 *)(*pauVar26 + 8);
        uVar58 = *(undefined8 *)(*pauVar26 + 0x10);
        auVar52 = *pauVar26;
        data_05[2]._0_4_ = h;
        data_05[0] = in_stack_fffffffffffffc80._0_8_;
        data_05[1] = in_stack_fffffffffffffc80._8_8_;
        data_05[2]._4_4_ = in_register_0000008c;
        data_05[3]._0_4_ = in_stack_fffffffffffffc98;
        data_05[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_05,&local_260,filt_01);
        uStack_2f8 = (undefined2)uVar56;
        uStack_2f6 = (undefined2)((ulong)uVar56 >> 0x10);
        uStack_2f4 = (undefined2)((ulong)uVar56 >> 0x20);
        uStack_2f2 = (undefined2)((ulong)uVar56 >> 0x30);
        uStack_2f0 = (undefined2)uVar57;
        uStack_2ee = (undefined2)((ulong)uVar57 >> 0x10);
        uStack_2ec = (undefined2)((ulong)uVar57 >> 0x20);
        uStack_2ea = (undefined2)((ulong)uVar57 >> 0x30);
        uStack_2e8 = (undefined2)uVar58;
        uStack_2e6 = (undefined2)((ulong)uVar58 >> 0x10);
        uStack_2e4 = (undefined2)((ulong)uVar58 >> 0x20);
        uStack_2e2 = (undefined2)((ulong)uVar58 >> 0x30);
        data_06[2]._0_4_ = h;
        data_06[0] = in_stack_fffffffffffffc80._0_8_;
        data_06[1] = in_stack_fffffffffffffc80._8_8_;
        data_06[2]._4_4_ = in_register_0000008c;
        data_06[3]._0_4_ = in_stack_fffffffffffffc98;
        data_06[3]._4_4_ = in_stack_fffffffffffffc9c;
        x_convolve_8tap_avx2(&local_1a0,data_06,&local_260,filt_02);
        auVar10._8_2_ = uStack_2f8;
        auVar10._0_8_ = uVar40;
        auVar10._10_2_ = uStack_2f6;
        auVar10._12_2_ = uStack_2f4;
        auVar10._14_2_ = uStack_2f2;
        auVar10._16_2_ = uStack_2f0;
        auVar10._18_2_ = uStack_2ee;
        auVar10._20_2_ = uStack_2ec;
        auVar10._22_2_ = uStack_2ea;
        auVar10._24_2_ = uStack_2e8;
        auVar10._26_2_ = uStack_2e6;
        auVar10._28_2_ = uStack_2e4;
        auVar10._30_2_ = uStack_2e2;
        auVar50 = vpaddw_avx2(local_360,auVar10);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,local_360);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        *pauVar29 = auVar50;
        pauVar26 = (undefined1 (*) [32])(puVar30 + (long)*pauVar26);
        pauVar29 = (undefined1 (*) [32])(*pauVar29 + CONCAT26(sStack_2fc,(int6)dst_stride));
        uVar22 = uVar22 - 1;
        palVar31 = extraout_RDX_05;
      } while (uVar22 != 0);
      return;
    }
    do {
      x_convolve_8tap_8x2_avx2
                ((__m256i *)(palVar31[-1] + 3),puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
      auVar52 = auVar50;
      x_convolve_8tap_8x2_avx2(palVar31,puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
      auVar50 = vpaddw_avx2(auVar54,auVar50);
      auVar75 = vpsraw_avx2(auVar50,6);
      auVar50 = vpaddw_avx2(auVar52,auVar54);
      auVar50 = vpsraw_avx2(auVar50,6);
      auVar50 = vpackuswb_avx2(auVar75,auVar50);
      *(undefined1 (*) [16])dst = auVar50._0_16_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + CONCAT26(sVar20,(int6)dst_stride)) =
           auVar50._16_16_;
      dst = *(undefined1 (*) [16])dst + CONCAT26(sStack_2fc,(int6)(dst_stride * 2));
      palVar31 = (__m256i *)((long)*palVar31 + (long)(src_stride * 2));
      h = h - 2;
    } while (h != 0);
    return;
  }
  if (iVar21 != 6) {
    return;
  }
  prepare_half_coeffs_6tap_avx2(filter_params_x,subpel_x_qn,&local_1a0);
  uVar22 = w << 0x1d | w - 8U >> 3;
  puVar30 = (uint8_t *)(long)src_stride;
  if (uVar22 < 8) {
    palVar31 = (__m256i *)(src + -2);
    switch(uVar22) {
    case 0:
      auVar45._8_2_ = 0x22;
      auVar45._0_8_ = 0x22002200220022;
      auVar45._10_2_ = 0x22;
      auVar45._12_2_ = 0x22;
      auVar45._14_2_ = 0x22;
      auVar45._16_2_ = 0x22;
      auVar45._18_2_ = 0x22;
      auVar45._20_2_ = 0x22;
      auVar45._22_2_ = 0x22;
      auVar45._24_2_ = 0x22;
      auVar45._26_2_ = 0x22;
      auVar45._28_2_ = 0x22;
      auVar45._30_2_ = 0x22;
      auVar55 = ZEXT3264(auVar45);
      do {
        auVar50 = auVar55._0_32_;
        x_convolve_6tap_8x2_avx2(palVar31,puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
        auVar50 = vpaddw_avx2(auVar50,auVar45);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar50,auVar50);
        *(long *)dst = auVar50._0_8_;
        auVar55 = ZEXT1664(auVar50._16_16_);
        *(long *)(dst + CONCAT26(sStack_2fc,(int6)dst_stride)) = auVar50._16_8_;
        palVar31 = (__m256i *)((long)*palVar31 + (long)(src_stride * 2));
        dst = dst + dst_stride * 2;
        h = h - 2;
      } while (h != 0);
      break;
    case 1:
      sStack_2fc = (short)(dst_stride * 2 >> 0x1f);
      palVar31 = (__m256i *)(src + 6);
      auVar53._8_2_ = 0x22;
      auVar53._0_8_ = 0x22002200220022;
      auVar53._10_2_ = 0x22;
      auVar53._12_2_ = 0x22;
      auVar53._14_2_ = 0x22;
      auVar53._16_2_ = 0x22;
      auVar53._18_2_ = 0x22;
      auVar53._20_2_ = 0x22;
      auVar53._22_2_ = 0x22;
      auVar53._24_2_ = 0x22;
      auVar53._26_2_ = 0x22;
      auVar53._28_2_ = 0x22;
      auVar53._30_2_ = 0x22;
      auVar50 = auVar53;
      do {
        x_convolve_6tap_8x2_avx2
                  ((__m256i *)(palVar31[-1] + 3),puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
        auVar52 = auVar50;
        x_convolve_6tap_8x2_avx2(palVar31,puVar30,(ptrdiff_t)local_1a0,&local_260,palVar27);
        auVar50 = vpaddw_avx2(auVar53,auVar50);
        auVar75 = vpsraw_avx2(auVar50,6);
        auVar50 = vpaddw_avx2(auVar52,auVar53);
        auVar50 = vpsraw_avx2(auVar50,6);
        auVar50 = vpackuswb_avx2(auVar75,auVar50);
        *(undefined1 (*) [16])dst = auVar50._0_16_;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + CONCAT26(sVar20,(int6)dst_stride)) =
             auVar50._16_16_;
        dst = *(undefined1 (*) [16])dst + CONCAT26(sStack_2fc,(int6)(dst_stride * 2));
        palVar31 = (__m256i *)((long)*palVar31 + (long)(src_stride * 2));
        h = h - 2;
      } while (h != 0);
      break;
    default:
      goto switchD_0036de63_caseD_2;
    case 3:
      do {
        sr_x_6tap_32_avx2((uint8_t *)palVar31,&local_1a0,&local_260,dst);
        palVar31 = (__m256i *)(puVar30 + (long)*palVar31);
        dst = dst + CONCAT26(sStack_2fc,(int6)dst_stride);
        h = h - 1;
      } while (h != 0);
      break;
    case 7:
      puVar32 = src + 0x1e;
      do {
        sr_x_6tap_32_avx2(puVar32 + -0x20,&local_1a0,&local_260,dst);
        sr_x_6tap_32_avx2(puVar32,&local_1a0,&local_260,dst + 0x20);
        dst = dst + CONCAT26(sStack_2fc,(int6)dst_stride);
        puVar32 = puVar32 + (long)puVar30;
        h = h - 1;
      } while (h != 0);
    }
  }
  else {
switchD_0036de63_caseD_2:
    puVar32 = src + 0x5e;
    do {
      sr_x_6tap_32_avx2(puVar32 + -0x60,&local_1a0,&local_260,dst);
      sr_x_6tap_32_avx2(puVar32 + -0x40,&local_1a0,&local_260,dst + 0x20);
      sr_x_6tap_32_avx2(puVar32 + -0x20,&local_1a0,&local_260,dst + 0x40);
      sr_x_6tap_32_avx2(puVar32,&local_1a0,&local_260,dst + 0x60);
      dst = dst + CONCAT26(sStack_2fc,(int6)dst_stride);
      puVar32 = puVar32 + (long)puVar30;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

void av1_convolve_x_sr_avx2(const uint8_t *src, int32_t src_stride,
                            uint8_t *dst, int32_t dst_stride, int32_t w,
                            int32_t h,
                            const InterpFilterParams *filter_params_x,
                            const int32_t subpel_x_qn,
                            ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int horz_tap = get_filter_tap(filter_params_x, subpel_x_qn);

  if (horz_tap == 12) {
    av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params);
  } else {
    av1_convolve_x_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                       filter_params_x, subpel_x_qn,
                                       conv_params);
  }
#else
  av1_convolve_x_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, subpel_x_qn, conv_params);
#endif
}